

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void absl::lts_20240722::container_internal::AssertSameContainer
               (ctrl_t *ctrl_a,ctrl_t *ctrl_b,void **slot_a,void **slot_b,
               GenerationType *generation_ptr_a,GenerationType *generation_ptr_b)

{
  bool bVar1;
  anon_class_1_0_00000001 fail_if;
  anon_class_1_0_00000001 local_22;
  anon_class_1_0_00000001 local_21;
  
  if ((code *)ctrl_b != absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
      (code *)ctrl_a != absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
    AssertSameContainer::anon_class_1_0_00000001::operator()
              (&local_21,
               ((code *)ctrl_a ==
               absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) !=
               ((code *)ctrl_b ==
               absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>),
               "Comparing default-constructed hashtable iterator with a non-default-constructed hashtable iterator."
              );
    bVar1 = AreItersFromSameContainer(ctrl_a,ctrl_b,slot_a,slot_b);
    if (!bVar1) {
      AssertSameContainer::anon_class_1_0_00000001::operator()(&local_22);
    }
  }
  return;
}

Assistant:

inline void AssertSameContainer(const ctrl_t* ctrl_a, const ctrl_t* ctrl_b,
                                const void* const& slot_a,
                                const void* const& slot_b,
                                const GenerationType* generation_ptr_a,
                                const GenerationType* generation_ptr_b) {
  if (!SwisstableDebugEnabled()) return;
  // `SwisstableDebugEnabled()` is also true for release builds with hardening
  // enabled. To minimize their impact in those builds:
  // - use `ABSL_PREDICT_FALSE()` to provide a compiler hint for code layout
  // - use `ABSL_RAW_LOG()` with a format string to reduce code size and improve
  //   the chances that the hot paths will be inlined.

  // fail_if(is_invalid, message) crashes when is_invalid is true and provides
  // an error message based on `message`.
  const auto fail_if = [](bool is_invalid, const char* message) {
    if (ABSL_PREDICT_FALSE(is_invalid)) {
      ABSL_RAW_LOG(FATAL, "Invalid iterator comparison. %s", message);
    }
  };

  const bool a_is_default = ctrl_a == EmptyGroup();
  const bool b_is_default = ctrl_b == EmptyGroup();
  if (a_is_default && b_is_default) return;
  fail_if(a_is_default != b_is_default,
          "Comparing default-constructed hashtable iterator with a "
          "non-default-constructed hashtable iterator.");

  if (SwisstableGenerationsEnabled()) {
    if (ABSL_PREDICT_TRUE(generation_ptr_a == generation_ptr_b)) return;
    // Users don't need to know whether the tables are SOO so don't mention SOO
    // in the debug message.
    const bool a_is_soo = IsSooControl(ctrl_a);
    const bool b_is_soo = IsSooControl(ctrl_b);
    fail_if(a_is_soo != b_is_soo || (a_is_soo && b_is_soo),
            "Comparing iterators from different hashtables.");

    const bool a_is_empty = IsEmptyGeneration(generation_ptr_a);
    const bool b_is_empty = IsEmptyGeneration(generation_ptr_b);
    fail_if(a_is_empty != b_is_empty,
            "Comparing an iterator from an empty hashtable with an iterator "
            "from a non-empty hashtable.");
    fail_if(a_is_empty && b_is_empty,
            "Comparing iterators from different empty hashtables.");

    const bool a_is_end = ctrl_a == nullptr;
    const bool b_is_end = ctrl_b == nullptr;
    fail_if(a_is_end || b_is_end,
            "Comparing iterator with an end() iterator from a different "
            "hashtable.");
    fail_if(true, "Comparing non-end() iterators from different hashtables.");
  } else {
    ABSL_HARDENING_ASSERT(
        AreItersFromSameContainer(ctrl_a, ctrl_b, slot_a, slot_b) &&
        "Invalid iterator comparison. The iterators may be from different "
        "containers or the container might have rehashed or moved. Consider "
        "running with --config=asan to diagnose issues.");
  }
}